

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = params->allow_witness;
  s->m_substream->nSize = s->m_substream->nSize + 4;
  if (bVar3 == true) {
    bVar3 = CMutableTransaction::HasWitness(tx);
    if (bVar3) {
      vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
                (s,&vinDummy);
      s->m_substream->nSize = s->m_substream->nSize + 1;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&vinDummy);
      Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
                (s,&tx->vin);
      Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
                (s,&tx->vout);
      lVar5 = 0x50;
      uVar4 = 0;
      while( true ) {
        pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar4)
        break;
        Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (s,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)((long)&(pCVar2->prevout).hash + lVar5));
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x68;
      }
      goto LAB_0029630d;
    }
  }
  Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
            (s,&tx->vin);
  Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
            (s,&tx->vout);
LAB_0029630d:
  s->m_substream->nSize = s->m_substream->nSize + 4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}